

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EverCrypt_Hash.c
# Opt level: O0

void update_last(EverCrypt_Hash_state_s *s,uint64_t prev_len,uint8_t *last,uint32_t last_len)

{
  Lib_IntVector_Intrinsics_vec256 *hash;
  undefined1 x [16];
  undefined1 totlen [16];
  undefined1 x_00 [16];
  undefined1 totlen_00 [16];
  undefined1 prev [16];
  undefined1 prev_00 [16];
  FStar_UInt128_uint128 *pFVar1;
  uint in_ECX;
  uint8_t *in_RDX;
  uint8_t *b;
  uint8_t *b_00;
  uint8_t *d;
  uint8_t *d_00;
  FStar_UInt128_uint128 *in_RSI;
  undefined8 *in_RDI;
  Lib_IntVector_Intrinsics_vec256 wv_3 [4];
  Lib_IntVector_Intrinsics_vec256 *p1_13;
  uint64_t wv_2 [16];
  uint64_t *p1_12;
  Lib_IntVector_Intrinsics_vec128 wv_1 [4];
  Lib_IntVector_Intrinsics_vec128 *p1_11;
  uint32_t wv [16];
  uint32_t *p1_10;
  uint64_t *p1_9;
  uint64_t *p1_8;
  uint64_t *p1_7;
  uint64_t *p1_6;
  uint64_t *p1_5;
  uint64_t *p1_4;
  uint32_t *p1_3;
  uint32_t *p1_2;
  uint32_t *p1_1;
  uint32_t *p1;
  EverCrypt_Hash_state_s scrut;
  undefined8 in_stack_fffffffffffffbe0;
  undefined8 in_stack_fffffffffffffbe8;
  undefined1 in_stack_fffffffffffffbf0 [16];
  longlong local_360 [17];
  Lib_IntVector_Intrinsics_vec256 *local_2d8;
  FStar_UInt128_uint128 *local_2d0;
  FStar_UInt128_uint128 *local_2c0;
  uint64_t local_2b0 [17];
  Lib_IntVector_Intrinsics_vec256 *local_228;
  longlong local_220 [9];
  Lib_IntVector_Intrinsics_vec256 *local_1d8;
  uint32_t local_1d0 [18];
  Lib_IntVector_Intrinsics_vec256 *local_188;
  Lib_IntVector_Intrinsics_vec256 *local_180;
  Lib_IntVector_Intrinsics_vec256 *local_178;
  Lib_IntVector_Intrinsics_vec256 *local_170;
  Lib_IntVector_Intrinsics_vec256 *local_168;
  FStar_UInt128_uint128 *local_160;
  FStar_UInt128_uint128 *local_150;
  FStar_UInt128_uint128 *local_140;
  FStar_UInt128_uint128 *local_130;
  FStar_UInt128_uint128 *local_120;
  FStar_UInt128_uint128 *local_110;
  Lib_IntVector_Intrinsics_vec256 *local_f8;
  FStar_UInt128_uint128 *local_f0;
  FStar_UInt128_uint128 *local_e0;
  FStar_UInt128_uint128 *local_d0;
  FStar_UInt128_uint128 *local_c0;
  FStar_UInt128_uint128 *local_b0;
  FStar_UInt128_uint128 *local_a0;
  Lib_IntVector_Intrinsics_vec256 *local_88;
  Lib_IntVector_Intrinsics_vec256 *local_80;
  Lib_IntVector_Intrinsics_vec256 *local_78;
  Lib_IntVector_Intrinsics_vec256 *local_70;
  Lib_IntVector_Intrinsics_vec256 *local_68;
  undefined8 local_60;
  Lib_IntVector_Intrinsics_vec256 *local_58;
  uint local_4c;
  uint8_t *local_48;
  FStar_UInt128_uint128 *local_40;
  
  local_60 = *in_RDI;
  hash = (Lib_IntVector_Intrinsics_vec256 *)in_RDI[1];
  local_58 = hash;
  if ((char)local_60 == '\0') {
    local_68 = hash;
    Hacl_Hash_MD5_update_last((uint32_t *)hash,(uint64_t)in_RSI,in_RDX,in_ECX);
  }
  else if ((char)local_60 == '\x01') {
    local_70 = hash;
    Hacl_Hash_SHA1_update_last((uint32_t *)hash,(uint64_t)in_RSI,in_RDX,in_ECX);
  }
  else if ((char)local_60 == '\x02') {
    local_78 = hash;
    Hacl_Hash_SHA2_sha224_update_last((long)in_RSI + (ulong)in_ECX,in_ECX,in_RDX,(uint32_t *)hash);
  }
  else if ((char)local_60 == '\x03') {
    local_80 = hash;
    Hacl_Hash_SHA2_sha256_update_last((long)in_RSI + (ulong)in_ECX,in_ECX,in_RDX,(uint32_t *)hash);
  }
  else {
    local_4c = in_ECX;
    if ((char)local_60 == '\x04') {
      local_88 = hash;
      pFVar1 = FStar_UInt128_uint64_to_uint128(in_RSI,(uint64_t)in_RSI);
      local_a0 = pFVar1;
      local_d0 = FStar_UInt128_uint64_to_uint128
                           ((FStar_UInt128_uint128 *)(ulong)local_4c,(uint64_t)in_RSI);
      x._8_8_ = in_stack_fffffffffffffbe8;
      x._0_8_ = in_stack_fffffffffffffbe0;
      local_c0 = pFVar1;
      local_b0 = local_d0;
      local_f0 = FStar_UInt128_add(pFVar1,(uint128_t)x,(uint128_t)in_stack_fffffffffffffbf0);
      totlen._8_8_ = in_stack_fffffffffffffbe8;
      totlen._0_8_ = in_stack_fffffffffffffbe0;
      local_e0 = local_f0;
      Hacl_Hash_SHA2_sha384_update_last
                ((FStar_UInt128_uint128)totlen,(uint32_t)local_f0,b,(uint64_t *)(ulong)local_4c);
    }
    else if ((char)local_60 == '\x05') {
      local_f8 = hash;
      pFVar1 = FStar_UInt128_uint64_to_uint128(in_RSI,(uint64_t)in_RSI);
      local_110 = pFVar1;
      local_140 = FStar_UInt128_uint64_to_uint128
                            ((FStar_UInt128_uint128 *)(ulong)local_4c,(uint64_t)in_RSI);
      x_00._8_8_ = in_stack_fffffffffffffbe8;
      x_00._0_8_ = in_stack_fffffffffffffbe0;
      local_130 = pFVar1;
      local_120 = local_140;
      local_160 = FStar_UInt128_add(pFVar1,(uint128_t)x_00,(uint128_t)in_stack_fffffffffffffbf0);
      totlen_00._8_8_ = in_stack_fffffffffffffbe8;
      totlen_00._0_8_ = in_stack_fffffffffffffbe0;
      local_150 = local_160;
      Hacl_Hash_SHA2_sha512_update_last
                ((FStar_UInt128_uint128)totlen_00,(uint32_t)local_160,b_00,
                 (uint64_t *)(ulong)local_4c);
    }
    else if ((char)local_60 == '\x06') {
      local_168 = hash;
      Hacl_Hash_SHA3_update_last_sha3('\t',(uint64_t *)hash,in_RDX,in_ECX);
    }
    else if ((char)local_60 == '\a') {
      local_170 = hash;
      Hacl_Hash_SHA3_update_last_sha3('\b',(uint64_t *)hash,in_RDX,in_ECX);
    }
    else if ((char)local_60 == '\b') {
      local_178 = hash;
      Hacl_Hash_SHA3_update_last_sha3('\n',(uint64_t *)hash,in_RDX,in_ECX);
    }
    else if ((char)local_60 == '\t') {
      local_180 = hash;
      Hacl_Hash_SHA3_update_last_sha3('\v',(uint64_t *)hash,in_RDX,in_ECX);
    }
    else {
      local_48 = in_RDX;
      local_40 = in_RSI;
      if ((char)local_60 == '\n') {
        local_188 = hash;
        memset(local_1d0,0,0x40);
        Hacl_Hash_Blake2s_update_last
                  (local_4c,local_1d0,(uint32_t *)local_188,(uint64_t)local_40,local_4c,local_48);
      }
      else if ((char)local_60 == '\v') {
        local_1d8 = hash;
        memset(local_220,0,0x40);
        Hacl_Hash_Blake2s_Simd128_update_last
                  (local_4c,(Lib_IntVector_Intrinsics_vec128 *)local_220,
                   (Lib_IntVector_Intrinsics_vec128 *)local_1d8,(uint64_t)local_40,local_4c,local_48
                  );
      }
      else if ((char)local_60 == '\f') {
        local_2b0[0xe] = 0;
        local_2b0[0xf] = 0;
        local_2b0[0xc] = 0;
        local_2b0[0xd] = 0;
        local_2b0[10] = 0;
        local_2b0[0xb] = 0;
        local_2b0[8] = 0;
        local_2b0[9] = 0;
        local_2b0[6] = 0;
        local_2b0[7] = 0;
        local_2b0[4] = 0;
        local_2b0[5] = 0;
        local_2b0[2] = 0;
        local_2b0[3] = 0;
        local_2b0[0] = 0;
        local_2b0[1] = 0;
        local_228 = hash;
        local_2d0 = FStar_UInt128_uint64_to_uint128(in_RSI,(uint64_t)in_RSI);
        prev._8_8_ = in_stack_fffffffffffffbe8;
        prev._0_8_ = local_48;
        local_2c0 = local_2d0;
        Hacl_Hash_Blake2b_update_last
                  (in_ECX,local_2b0,(uint64_t *)hash,(FStar_UInt128_uint128)prev,(uint32_t)local_2d0
                   ,d);
      }
      else {
        if ((char)local_60 != '\r') {
          fprintf(_stderr,"KaRaMeL abort at %s:%d\n%s\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/cryspen[P]hacl-packages/src/EverCrypt_Hash.c"
                  ,0x299,"unreachable (pattern matches are exhaustive in F*)");
          exit(0xff);
        }
        local_360[0xe] = 0;
        local_360[0xf] = 0;
        local_360[0xc] = 0;
        local_360[0xd] = 0;
        local_360[10] = 0;
        local_360[0xb] = 0;
        local_360[8] = 0;
        local_360[9] = 0;
        local_360[6] = 0;
        local_360[7] = 0;
        local_360[4] = 0;
        local_360[5] = 0;
        local_360[2] = 0;
        local_360[3] = 0;
        local_360[0] = 0;
        local_360[1] = 0;
        local_2d8 = hash;
        pFVar1 = FStar_UInt128_uint64_to_uint128(in_RSI,(uint64_t)in_RSI);
        prev_00._8_8_ = in_stack_fffffffffffffbe8;
        prev_00._0_8_ = local_48;
        Hacl_Hash_Blake2b_Simd256_update_last
                  (in_ECX,(Lib_IntVector_Intrinsics_vec256 *)local_360,hash,
                   (FStar_UInt128_uint128)prev_00,(uint32_t)pFVar1,d_00);
      }
    }
  }
  return;
}

Assistant:

static void
update_last(EverCrypt_Hash_state_s *s, uint64_t prev_len, uint8_t *last, uint32_t last_len)
{
  EverCrypt_Hash_state_s scrut = *s;
  if (scrut.tag == MD5_s)
  {
    uint32_t *p1 = scrut.case_MD5_s;
    Hacl_Hash_MD5_update_last(p1, prev_len, last, last_len);
    return;
  }
  if (scrut.tag == SHA1_s)
  {
    uint32_t *p1 = scrut.case_SHA1_s;
    Hacl_Hash_SHA1_update_last(p1, prev_len, last, last_len);
    return;
  }
  if (scrut.tag == SHA2_224_s)
  {
    uint32_t *p1 = scrut.case_SHA2_224_s;
    Hacl_Hash_SHA2_sha224_update_last(prev_len + (uint64_t)last_len, last_len, last, p1);
    return;
  }
  if (scrut.tag == SHA2_256_s)
  {
    uint32_t *p1 = scrut.case_SHA2_256_s;
    Hacl_Hash_SHA2_sha256_update_last(prev_len + (uint64_t)last_len, last_len, last, p1);
    return;
  }
  if (scrut.tag == SHA2_384_s)
  {
    uint64_t *p1 = scrut.case_SHA2_384_s;
    Hacl_Hash_SHA2_sha384_update_last(FStar_UInt128_add(FStar_UInt128_uint64_to_uint128(prev_len),
        FStar_UInt128_uint64_to_uint128((uint64_t)last_len)),
      last_len,
      last,
      p1);
    return;
  }
  if (scrut.tag == SHA2_512_s)
  {
    uint64_t *p1 = scrut.case_SHA2_512_s;
    Hacl_Hash_SHA2_sha512_update_last(FStar_UInt128_add(FStar_UInt128_uint64_to_uint128(prev_len),
        FStar_UInt128_uint64_to_uint128((uint64_t)last_len)),
      last_len,
      last,
      p1);
    return;
  }
  if (scrut.tag == SHA3_224_s)
  {
    uint64_t *p1 = scrut.case_SHA3_224_s;
    Hacl_Hash_SHA3_update_last_sha3(Spec_Hash_Definitions_SHA3_224, p1, last, last_len);
    return;
  }
  if (scrut.tag == SHA3_256_s)
  {
    uint64_t *p1 = scrut.case_SHA3_256_s;
    Hacl_Hash_SHA3_update_last_sha3(Spec_Hash_Definitions_SHA3_256, p1, last, last_len);
    return;
  }
  if (scrut.tag == SHA3_384_s)
  {
    uint64_t *p1 = scrut.case_SHA3_384_s;
    Hacl_Hash_SHA3_update_last_sha3(Spec_Hash_Definitions_SHA3_384, p1, last, last_len);
    return;
  }
  if (scrut.tag == SHA3_512_s)
  {
    uint64_t *p1 = scrut.case_SHA3_512_s;
    Hacl_Hash_SHA3_update_last_sha3(Spec_Hash_Definitions_SHA3_512, p1, last, last_len);
    return;
  }
  if (scrut.tag == Blake2S_s)
  {
    uint32_t *p1 = scrut.case_Blake2S_s;
    uint32_t wv[16U] = { 0U };
    Hacl_Hash_Blake2s_update_last(last_len, wv, p1, prev_len, last_len, last);
    return;
  }
  if (scrut.tag == Blake2S_128_s)
  {
    Lib_IntVector_Intrinsics_vec128 *p1 = scrut.case_Blake2S_128_s;
    #if HACL_CAN_COMPILE_VEC128
    KRML_PRE_ALIGN(16) Lib_IntVector_Intrinsics_vec128 wv[4U] KRML_POST_ALIGN(16) = { 0U };
    Hacl_Hash_Blake2s_Simd128_update_last(last_len, wv, p1, prev_len, last_len, last);
    return;
    #else
    KRML_MAYBE_UNUSED_VAR(p1);
    return;
    #endif
  }
  if (scrut.tag == Blake2B_s)
  {
    uint64_t *p1 = scrut.case_Blake2B_s;
    uint64_t wv[16U] = { 0U };
    Hacl_Hash_Blake2b_update_last(last_len,
      wv,
      p1,
      FStar_UInt128_uint64_to_uint128(prev_len),
      last_len,
      last);
    return;
  }
  if (scrut.tag == Blake2B_256_s)
  {
    Lib_IntVector_Intrinsics_vec256 *p1 = scrut.case_Blake2B_256_s;
    #if HACL_CAN_COMPILE_VEC256
    KRML_PRE_ALIGN(32) Lib_IntVector_Intrinsics_vec256 wv[4U] KRML_POST_ALIGN(32) = { 0U };
    Hacl_Hash_Blake2b_Simd256_update_last(last_len,
      wv,
      p1,
      FStar_UInt128_uint64_to_uint128(prev_len),
      last_len,
      last);
    return;
    #else
    KRML_MAYBE_UNUSED_VAR(p1);
    return;
    #endif
  }
  KRML_HOST_EPRINTF("KaRaMeL abort at %s:%d\n%s\n",
    __FILE__,
    __LINE__,
    "unreachable (pattern matches are exhaustive in F*)");
  KRML_HOST_EXIT(255U);
}